

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

string * __thiscall
spirv_cross::CompilerGLSL::argument_decl_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,Parameter *arg)

{
  bool bVar1;
  ExecutionModel EVar2;
  SPIRType *type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_2;
  char *direction;
  char *local_88;
  undefined1 *local_80 [2];
  undefined1 local_70 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  char *local_40 [2];
  char local_30 [16];
  
  type = Compiler::expression_type(&this->super_Compiler,(arg->id).id);
  local_88 = "";
  bVar1 = Compiler::is_pointer(&this->super_Compiler,type);
  if (!bVar1) goto LAB_0030726f;
  if (type->storage - Private < 2) {
LAB_00307206:
    if ((arg->write_count != 0) && (arg->read_count != 0)) {
      local_88 = "inout ";
      goto LAB_0030726f;
    }
    if (arg->write_count == 0) goto LAB_0030726f;
  }
  else {
    if (type->storage != Output) goto LAB_0030726f;
    EVar2 = Compiler::get_execution_model(&this->super_Compiler);
    if ((((EVar2 != ExecutionModelMeshEXT) ||
         (bVar1 = Compiler::has_decoration
                            (&this->super_Compiler,(ID)(type->super_IVariant).self.id,Block), !bVar1
         )) || (bVar1 = Compiler::is_builtin_type(&this->super_Compiler,type), !bVar1)) ||
       (arg->write_count == 0)) goto LAB_00307206;
  }
  local_88 = "out ";
LAB_0030726f:
  (*(this->super_Compiler)._vptr_Compiler[0x33])(local_40,this,(ulong)(arg->id).id);
  (*(this->super_Compiler)._vptr_Compiler[6])(local_80,this,(ulong)(arg->id).id,1);
  ts_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)(arg->id).id;
  (*(this->super_Compiler)._vptr_Compiler[0x1b])(&local_60,this,type,local_80);
  join<char_const*&,std::__cxx11::string,std::__cxx11::string>
            (__return_storage_ptr__,(spirv_cross *)&local_88,local_40,&local_60,ts_2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if (local_80[0] != local_70) {
    operator_delete(local_80[0]);
  }
  if (local_40[0] != local_30) {
    operator_delete(local_40[0]);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::argument_decl(const SPIRFunction::Parameter &arg)
{
	// glslangValidator seems to make all arguments pointer no matter what which is rather bizarre ...
	auto &type = expression_type(arg.id);
	const char *direction = "";

	if (is_pointer(type) &&
	    (type.storage == StorageClassFunction ||
	     type.storage == StorageClassPrivate ||
	     type.storage == StorageClassOutput))
	{
		// If we're passing around block types to function, we really mean reference in a pointer sense,
		// but DXC does not like inout for mesh blocks, so workaround that. out is technically not correct,
		// but it works in practice due to legalization. It's ... not great, but you gotta do what you gotta do.
		// GLSL will never hit this case since it's not valid.
		if (type.storage == StorageClassOutput && get_execution_model() == ExecutionModelMeshEXT &&
		    has_decoration(type.self, DecorationBlock) && is_builtin_type(type) && arg.write_count)
		{
			direction = "out ";
		}
		else if (arg.write_count && arg.read_count)
			direction = "inout ";
		else if (arg.write_count)
			direction = "out ";
	}

	return join(direction, to_qualifiers_glsl(arg.id), variable_decl(type, to_name(arg.id), arg.id));
}